

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullable.cpp
# Opt level: O3

ColumnRef __thiscall clickhouse::ColumnNullable::Slice(ColumnNullable *this,size_t begin,size_t len)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  ColumnRef CVar3;
  undefined1 local_59;
  _func_int **local_58;
  element_type *peStack_50;
  shared_ptr<clickhouse::Column> local_40;
  shared_ptr<clickhouse::Column> local_30;
  
  (**(code **)(**(long **)(begin + 0x28) + 0x38))(&local_30);
  (**(code **)(**(long **)(begin + 0x38) + 0x38))(&local_40,*(long **)(begin + 0x38),len);
  std::__shared_ptr<clickhouse::ColumnNullable,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<clickhouse::ColumnNullable>,std::shared_ptr<clickhouse::Column>,std::shared_ptr<clickhouse::Column>>
            ((__shared_ptr<clickhouse::ColumnNullable,(__gnu_cxx::_Lock_policy)2> *)&local_58,
             (allocator<clickhouse::ColumnNullable> *)&local_59,&local_30,&local_40);
  peVar1 = peStack_50;
  peStack_50 = (element_type *)0x0;
  (this->super_Column)._vptr_Column = local_58;
  (this->super_Column).super_enable_shared_from_this<clickhouse::Column>._M_weak_this.
  super___weak_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  local_58 = (_func_int **)0x0;
  _Var2._M_pi = extraout_RDX;
  if (local_40.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var2._M_pi = extraout_RDX_00;
  }
  if (local_30.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var2._M_pi = extraout_RDX_01;
  }
  CVar3.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  CVar3.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_Column;
  return (ColumnRef)CVar3.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ColumnRef ColumnNullable::Slice(size_t begin, size_t len) {
    return std::make_shared<ColumnNullable>(nested_->Slice(begin, len), nulls_->Slice(begin, len));
}